

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O2

string * CLI::detail::remove_quotes(string *str)

{
  byte bVar1;
  byte *pbVar2;
  pointer pcVar3;
  uint uVar4;
  
  if (1 < str->_M_string_length) {
    pbVar2 = (byte *)(str->_M_dataplus)._M_p;
    bVar1 = *pbVar2;
    uVar4 = bVar1 - 0x22;
    if (((uVar4 < 0x3f) && ((0x4000000000000021U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) &&
       (bVar1 == pbVar2[str->_M_string_length - 1])) {
      ::std::__cxx11::string::pop_back();
      pcVar3 = (str->_M_dataplus)._M_p;
      ::std::__cxx11::string::erase(str,pcVar3,pcVar3 + 1);
    }
  }
  return str;
}

Assistant:

CLI11_INLINE std::string &remove_quotes(std::string &str) {
    if(str.length() > 1 && (str.front() == '"' || str.front() == '\'' || str.front() == '`')) {
        if(str.front() == str.back()) {
            str.pop_back();
            str.erase(str.begin(), str.begin() + 1);
        }
    }
    return str;
}